

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

tchar_t Base64Char(wchar_t Value)

{
  char local_9;
  wchar_t Value_local;
  
  local_9 = (char)Value;
  if (Value < L'\x1a') {
    local_9 = local_9 + 'A';
  }
  else if (Value < L'4') {
    local_9 = local_9 + 'G';
  }
  else if (Value < L'>') {
    local_9 = local_9 + -4;
  }
  else if (Value == L'>') {
    local_9 = '+';
  }
  else {
    if (Value != L'?') {
      __assert_fail("Value == 63",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                    ,0x277,"tchar_t Base64Char(int)");
    }
    local_9 = '/';
  }
  return local_9;
}

Assistant:

static tchar_t Base64Char(int Value)
{
    if (Value < 26)
        return (tchar_t)(Value + 'A');
    if (Value < 52)
        return (tchar_t)(Value - 26 + 'a');
    if (Value < 62)
        return (tchar_t)(Value - 52 + '0');
    if (Value == 62)
        return '+';
    assert(Value == 63);
    return '/';
}